

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne_twister.hpp
# Opt level: O1

void __thiscall
boost::random::
mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
::twist(mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
        *this)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  
  lVar13 = 0;
  do {
    uVar14 = 0x9908b0df;
    if ((this->x[lVar13 + 1] & 1) == 0) {
      uVar14 = 0;
    }
    this->x[lVar13] =
         uVar14 ^ this->x[lVar13 + 0x18d] ^
         (this->x[lVar13 + 1] & 0x7ffffffe | this->x[lVar13] & 0x80000000) >> 1;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0xde);
  lVar13 = -5;
  do {
    uVar14 = 0x9908b0df;
    if ((this->x[lVar13 + 0xe4] & 1) == 0) {
      uVar14 = 0;
    }
    this->x[lVar13 + 0xe3] =
         uVar14 ^ *(uint *)((long)&this->i + lVar13 * 4) ^
         (this->x[lVar13 + 0xe4] & 0x7ffffffe | this->x[lVar13 + 0xe3] & 0x80000000) >> 1;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0);
  lVar13 = 0xe4;
  do {
    puVar2 = this->x + lVar13 + -1;
    uVar7 = puVar2[1];
    uVar8 = puVar2[2];
    uVar9 = puVar2[3];
    puVar1 = this->x + lVar13;
    uVar14 = puVar1[1];
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar4 = (uint *)((long)this + lVar13 * 4 + -0x390);
    uVar10 = puVar4[1];
    uVar11 = puVar4[2];
    uVar12 = puVar4[3];
    puVar3 = this->x + lVar13 + -1;
    *puVar3 = (int)(*puVar1 << 0x1f) >> 0x1f & 0x9908b0dfU ^
              (*puVar1 & 0x7ffffffe | *puVar2 & 0x80000000) >> 1 ^ *puVar4;
    puVar3[1] = (int)(uVar14 << 0x1f) >> 0x1f & 0x9908b0dfU ^
                (uVar14 & 0x7ffffffe | uVar7 & 0x80000000) >> 1 ^ uVar10;
    puVar3[2] = (int)(uVar5 << 0x1f) >> 0x1f & 0x9908b0dfU ^
                (uVar5 & 0x7ffffffe | uVar8 & 0x80000000) >> 1 ^ uVar11;
    puVar3[3] = (int)(uVar6 << 0x1f) >> 0x1f & 0x9908b0dfU ^
                (uVar6 & 0x7ffffffe | uVar9 & 0x80000000) >> 1 ^ uVar12;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0x270);
  uVar14 = 0x9908b0df;
  if ((this->x[0] & 1) == 0) {
    uVar14 = 0;
  }
  this->x[0x26f] =
       uVar14 ^ this->x[0x18c] ^ (this->x[0] & 0x7ffffffe | this->x[0x26f] & 0x80000000) >> 1;
  this->i = 0;
  return;
}

Assistant:

void
mersenne_twister_engine<UIntType,w,n,m,r,a,u,d,s,b,t,c,l,f>::twist()
{
    const UIntType upper_mask = (~static_cast<UIntType>(0)) << r;
    const UIntType lower_mask = ~upper_mask;

    const std::size_t unroll_factor = 6;
    const std::size_t unroll_extra1 = (n-m) % unroll_factor;
    const std::size_t unroll_extra2 = (m-1) % unroll_factor;

    // split loop to avoid costly modulo operations
    {  // extra scope for MSVC brokenness w.r.t. for scope
        for(std::size_t j = 0; j < n-m-unroll_extra1; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j+m] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    {
        for(std::size_t j = n-m-unroll_extra1; j < n-m; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j+m] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    {
        for(std::size_t j = n-m; j < n-1-unroll_extra2; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j-(n-m)] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    {
        for(std::size_t j = n-1-unroll_extra2; j < n-1; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j-(n-m)] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    // last iteration
    UIntType y = (x[n-1] & upper_mask) | (x[0] & lower_mask);
    x[n-1] = x[m-1] ^ (y >> 1) ^ ((x[0]&1) * a);
    i = 0;
}